

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

int slist_search(int n,Symbol *s)

{
  ulong uVar1;
  uint *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  puVar2 = (uint *)s->slist_info_;
  if (puVar2 == (uint *)0x0) {
    diag(s->name," not really a STATE; Ie. No differential equation for it.\n");
  }
  uVar5 = 0;
  uVar4 = (ulong)*puVar2;
  if ((int)*puVar2 < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar4 == uVar5) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                    ,0xaba,"int slist_search()");
    }
    uVar1 = uVar5 + 1;
    lVar3 = uVar5 * 2;
    uVar5 = uVar1;
  } while (puVar2[lVar3 + 1] != n);
  return puVar2[uVar1 * 2];
}

Assistant:

int slist_search(n, s) int n; Symbol* s; {
	int i, *pi;
	pi = s->slist_info_;
if (pi == (int*)0) {
	diag(s->name, " not really a STATE; Ie. No differential equation for it.\n");
}
	assert(pi);
	for (i=0; i < pi[0]; ++i) {
		if (pi[1+2*i] == n) {
			return pi[2+2*i];
		}
	}
	assert(0);
	return 0;
}